

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QString,ProStringList>>::
emplace<std::pair<QString,ProStringList>>
          (QMovableArrayOps<std::pair<QString,ProStringList>> *this,qsizetype i,
          pair<QString,_ProStringList> *args)

{
  undefined8 *puVar1;
  int *piVar2;
  qsizetype qVar3;
  long lVar4;
  Data *pDVar5;
  char16_t *pcVar6;
  Data *pDVar7;
  ProString *pPVar8;
  long lVar9;
  long in_FS_OFFSET;
  QArrayDataPointer<ProString> QStack_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  piVar2 = *(int **)this;
  if ((piVar2 == (int *)0x0) || (1 < *piVar2)) {
LAB_00246f84:
    pDVar5 = (args->first).d.d;
    pcVar6 = (args->first).d.ptr;
    (args->first).d.d = (Data *)0x0;
    (args->first).d.ptr = (char16_t *)0x0;
    qVar3 = (args->first).d.size;
    (args->first).d.size = 0;
    QStack_50.d = (args->second).super_QList<ProString>.d.d;
    QStack_50.ptr = (args->second).super_QList<ProString>.d.ptr;
    (args->second).super_QList<ProString>.d.d = (Data *)0x0;
    (args->second).super_QList<ProString>.d.ptr = (ProString *)0x0;
    QStack_50.size = (args->second).super_QList<ProString>.d.size;
    (args->second).super_QList<ProString>.d.size = 0;
    lVar9 = *(long *)(this + 0x10);
    QArrayDataPointer<std::pair<QString,_ProStringList>_>::detachAndGrow
              ((QArrayDataPointer<std::pair<QString,_ProStringList>_> *)this,
               (uint)(i == 0 && lVar9 != 0),1,(pair<QString,_ProStringList> **)0x0,
               (QArrayDataPointer<std::pair<QString,_ProStringList>_> *)0x0);
    lVar4 = *(long *)(this + 8);
    if (i == 0 && lVar9 != 0) {
      *(Data **)(lVar4 + -0x30) = pDVar5;
      *(char16_t **)(lVar4 + -0x28) = pcVar6;
      *(qsizetype *)(lVar4 + -0x20) = qVar3;
      *(Data **)(lVar4 + -0x18) = QStack_50.d;
      *(ProString **)(lVar4 + -0x10) = QStack_50.ptr;
      *(qsizetype *)(lVar4 + -8) = QStack_50.size;
      *(long *)(this + 8) = lVar4 + -0x30;
    }
    else {
      puVar1 = (undefined8 *)(lVar4 + i * 0x30);
      memmove(puVar1 + 6,(void *)(lVar4 + i * 0x30),(*(long *)(this + 0x10) - i) * 0x30);
      *puVar1 = pDVar5;
      puVar1[1] = pcVar6;
      puVar1[2] = qVar3;
      puVar1[3] = QStack_50.d;
      puVar1[4] = QStack_50.ptr;
      puVar1[5] = QStack_50.size;
    }
    QStack_50.size = 0;
    QStack_50.ptr = (ProString *)0x0;
    QStack_50.d = (Data *)0x0;
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
    QArrayDataPointer<ProString>::~QArrayDataPointer(&QStack_50);
  }
  else {
    lVar9 = *(long *)(this + 0x10);
    if ((lVar9 == i && piVar2 != (int *)0x0) &&
       (*(long *)(piVar2 + 2) - lVar9 !=
        ((long)(*(long *)(this + 8) - ((long)piVar2 + 0x1fU & 0xfffffffffffffff0)) >> 4) *
        -0x5555555555555555)) {
      lVar4 = *(long *)(this + 8);
      lVar9 = lVar9 * 0x30;
      pDVar5 = (args->first).d.d;
      (args->first).d.d = (Data *)0x0;
      *(Data **)(lVar4 + lVar9) = pDVar5;
      pcVar6 = (args->first).d.ptr;
      (args->first).d.ptr = (char16_t *)0x0;
      *(char16_t **)(lVar4 + 8 + lVar9) = pcVar6;
      qVar3 = (args->first).d.size;
      (args->first).d.size = 0;
      *(qsizetype *)(lVar4 + 0x10 + lVar9) = qVar3;
      pDVar7 = (args->second).super_QList<ProString>.d.d;
      (args->second).super_QList<ProString>.d.d = (Data *)0x0;
      *(Data **)(lVar4 + 0x18 + lVar9) = pDVar7;
      pPVar8 = (args->second).super_QList<ProString>.d.ptr;
      (args->second).super_QList<ProString>.d.ptr = (ProString *)0x0;
      *(ProString **)(lVar4 + 0x20 + lVar9) = pPVar8;
      qVar3 = (args->second).super_QList<ProString>.d.size;
      (args->second).super_QList<ProString>.d.size = 0;
      *(qsizetype *)(lVar4 + 0x28 + lVar9) = qVar3;
    }
    else {
      if (((i != 0) || (piVar2 == (int *)0x0)) ||
         (((long)piVar2 + 0x1fU & 0xfffffffffffffff0) == *(ulong *)(this + 8))) goto LAB_00246f84;
      lVar9 = *(long *)(this + 8);
      pDVar5 = (args->first).d.d;
      (args->first).d.d = (Data *)0x0;
      *(Data **)(lVar9 + -0x30) = pDVar5;
      pcVar6 = (args->first).d.ptr;
      (args->first).d.ptr = (char16_t *)0x0;
      *(char16_t **)(lVar9 + -0x28) = pcVar6;
      qVar3 = (args->first).d.size;
      (args->first).d.size = 0;
      *(qsizetype *)(lVar9 + -0x20) = qVar3;
      pDVar7 = (args->second).super_QList<ProString>.d.d;
      (args->second).super_QList<ProString>.d.d = (Data *)0x0;
      *(Data **)(lVar9 + -0x18) = pDVar7;
      pPVar8 = (args->second).super_QList<ProString>.d.ptr;
      (args->second).super_QList<ProString>.d.ptr = (ProString *)0x0;
      *(ProString **)(lVar9 + -0x10) = pPVar8;
      qVar3 = (args->second).super_QList<ProString>.d.size;
      (args->second).super_QList<ProString>.d.size = 0;
      *(qsizetype *)(lVar9 + -8) = qVar3;
      *(long *)(this + 8) = *(long *)(this + 8) + -0x30;
    }
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }